

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<PairedReadsMapper> * __thiscall
pybind11::class_<PairedReadsMapper>::
def_property_static<pybind11::is_method,pybind11::return_value_policy>
          (class_<PairedReadsMapper> *this,char *name,cpp_function *fget,cpp_function *fset,
          is_method *extra,return_value_policy *extra_1)

{
  handle h;
  function_record *pfVar1;
  PyTypeObject *pPVar2;
  char *pcVar3;
  class_<PairedReadsMapper> *in_RDI;
  EVP_PKEY_CTX *in_R8;
  char *doc_prev_1;
  char *doc_prev;
  function_record *rec_active;
  handle in_stack_00000038;
  function_record *rec_fset;
  function_record *rec_fget;
  handle in_stack_ffffffffffffffc8;
  
  h.m_ptr = (PyObject *)get_function_record(in_stack_ffffffffffffffc8);
  pfVar1 = get_function_record(h);
  if (h.m_ptr != (PyObject *)0x0) {
    pPVar2 = (h.m_ptr)->ob_type;
    pybind11::detail::process_attributes<pybind11::is_method,_pybind11::return_value_policy>::init
              (in_R8);
    if (((h.m_ptr)->ob_type != (PyTypeObject *)0x0) && ((h.m_ptr)->ob_type != pPVar2)) {
      free(pPVar2);
      pPVar2 = (PyTypeObject *)strdup((char *)(h.m_ptr)->ob_type);
      (h.m_ptr)->ob_type = pPVar2;
    }
  }
  if (pfVar1 != (function_record *)0x0) {
    pcVar3 = pfVar1->doc;
    pybind11::detail::process_attributes<pybind11::is_method,_pybind11::return_value_policy>::init
              (in_R8);
    if ((pfVar1->doc != (char *)0x0) && (pfVar1->doc != pcVar3)) {
      free(pcVar3);
      pcVar3 = strdup(pfVar1->doc);
      pfVar1->doc = pcVar3;
    }
  }
  pybind11::detail::generic_type::def_property_static_impl
            ((generic_type *)rec_active,doc_prev,(handle)rec_fset,in_stack_00000038,
             (function_record *)doc_prev_1);
  return in_RDI;
}

Assistant:

class_ &def_property_static(const char *name, const cpp_function &fget, const cpp_function &fset, const Extra& ...extra) {
        static_assert( 0 == detail::constexpr_sum(std::is_base_of<arg, Extra>::value...),
                      "Argument annotations are not allowed for properties");
        auto rec_fget = get_function_record(fget), rec_fset = get_function_record(fset);
        auto *rec_active = rec_fget;
        if (rec_fget) {
           char *doc_prev = rec_fget->doc; /* 'extra' field may include a property-specific documentation string */
           detail::process_attributes<Extra...>::init(extra..., rec_fget);
           if (rec_fget->doc && rec_fget->doc != doc_prev) {
              free(doc_prev);
              rec_fget->doc = strdup(rec_fget->doc);
           }
        }
        if (rec_fset) {
            char *doc_prev = rec_fset->doc;
            detail::process_attributes<Extra...>::init(extra..., rec_fset);
            if (rec_fset->doc && rec_fset->doc != doc_prev) {
                free(doc_prev);
                rec_fset->doc = strdup(rec_fset->doc);
            }
            if (! rec_active) rec_active = rec_fset;
        }
        def_property_static_impl(name, fget, fset, rec_active);
        return *this;
    }